

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_reader.h
# Opt level: O1

void cppwinrt::reader::parse_command_line<char>
               (char *cmdstart,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *argv,size_t *argument_count)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  string arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_t *local_40;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  bVar2 = false;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  *argument_count = 0;
  bVar3 = true;
  local_40 = argument_count;
  local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)argv;
  while( true ) {
    if (*cmdstart != '\0') {
      for (; (*cmdstart == ' ' || (*cmdstart == '\t')); cmdstart = cmdstart + 1) {
      }
    }
    if (!bVar3) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>(local_38,&local_60);
      local_60._M_string_length = 0;
      *local_60._M_dataplus._M_p = '\0';
      *local_40 = *local_40 + 1;
    }
    if (*cmdstart == '\0') break;
    while( true ) {
      uVar7 = 0;
      while( true ) {
        pcVar5 = cmdstart + 1;
        if (*cmdstart != '\\') break;
        uVar7 = uVar7 + 1;
        cmdstart = pcVar5;
      }
      if (*cmdstart == '\"') {
        bVar3 = true;
        pcVar6 = cmdstart;
        if (((uVar7 & 1) == 0) && ((!bVar2 || (pcVar6 = pcVar5, *pcVar5 != '\"')))) {
          bVar2 = (bool)(bVar2 ^ 1);
          bVar3 = false;
          pcVar6 = cmdstart;
        }
        uVar7 = uVar7 >> 1;
        cmdstart = pcVar6;
      }
      else {
        bVar3 = true;
      }
      iVar8 = uVar7 + 1;
      while( true ) {
        iVar8 = iVar8 + -1;
        cVar4 = (char)&local_60;
        if (iVar8 == 0) break;
        std::__cxx11::string::push_back(cVar4);
      }
      cVar1 = *cmdstart;
      if ((cVar1 == '\0') || ((!bVar2 && ((cVar1 == '\t' || (cVar1 == ' ')))))) break;
      if (bVar3) {
        std::__cxx11::string::push_back(cVar4);
      }
      cmdstart = cmdstart + 1;
    }
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

static void parse_command_line(Character* cmdstart, std::vector<std::string>& argv, size_t* argument_count)
        {

            std::string arg;
            bool copy_character;
            unsigned backslash_count;
            bool in_quotes;
            bool first_arg;

            Character* p = cmdstart;
            in_quotes = false;
            first_arg = true;
            *argument_count = 0;

            while (true)
            {
                if (*p)
                {
                    while (*p == ' ' || *p == '\t')
                        ++p;
                }

                if (!first_arg)
                {
                    argv.emplace_back(arg);
                    arg.clear();
                    ++*argument_count;
                }

                if (*p == '\0')
                    break;

                while (true)
                {
                    copy_character = true;

                    // Rules:
                    // 2N     backslashes   + " ==> N backslashes and begin/end quote
                    // 2N + 1 backslashes   + " ==> N backslashes + literal "
                    // N      backslashes       ==> N backslashes
                    backslash_count = 0;

                    while (*p == '\\')
                    {
                        ++p;
                        ++backslash_count;
                    }

                    if (*p == '"')
                    {
                        // if 2N backslashes before, start/end quote, otherwise
                        // copy literally:
                        if (backslash_count % 2 == 0)
                        {
                            if (in_quotes && p[1] == '"')
                            {
                                p++; // Double quote inside quoted string
                            }
                            else
                            {
                                // Skip first quote char and copy second:
                                copy_character = false;
                                in_quotes = !in_quotes;
                            }
                        }

                        backslash_count /= 2;
                    }

                    while (backslash_count--)
                    {
                        arg.push_back('\\');
                    }

                    if (*p == '\0' || (!in_quotes && (*p == ' ' || *p == '\t')))
                        break;

                    if (copy_character)
                    {
                        arg.push_back(*p);
                    }

                    ++p;
                }

                first_arg = false;
            }
        }